

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O1

void Wlc_Init(Abc_Frame_t *pAbc)

{
  Cmd_CommandAdd(pAbc,"Word level","%read",Abc_CommandReadWlc,0);
  Cmd_CommandAdd(pAbc,"Word level","%write",Abc_CommandWriteWlc,0);
  Cmd_CommandAdd(pAbc,"Word level","%ps",Abc_CommandPs,0);
  Cmd_CommandAdd(pAbc,"Word level","%blast",Abc_CommandBlast,0);
  Cmd_CommandAdd(pAbc,"Word level","%psinv",Abc_CommandPsInv,0);
  Cmd_CommandAdd(pAbc,"Word level","%getinv",Abc_CommandGetInv,0);
  Cmd_CommandAdd(pAbc,"Word level","%test",Abc_CommandTest,0);
  return;
}

Assistant:

void Wlc_Init( Abc_Frame_t * pAbc )
{
    Cmd_CommandAdd( pAbc, "Word level", "%read",       Abc_CommandReadWlc,   0 );
    Cmd_CommandAdd( pAbc, "Word level", "%write",      Abc_CommandWriteWlc,  0 );
    Cmd_CommandAdd( pAbc, "Word level", "%ps",         Abc_CommandPs,        0 );
    Cmd_CommandAdd( pAbc, "Word level", "%blast",      Abc_CommandBlast,     0 );
    Cmd_CommandAdd( pAbc, "Word level", "%psinv",      Abc_CommandPsInv,     0 );
    Cmd_CommandAdd( pAbc, "Word level", "%getinv",     Abc_CommandGetInv,    0 );
    Cmd_CommandAdd( pAbc, "Word level", "%test",       Abc_CommandTest,      0 );
}